

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

int __thiscall Fl_Input_::handletext(Fl_Input_ *this,int event,int X,int Y,int W,int H)

{
  int W_00;
  int H_00;
  int iVar1;
  Fl_Window *pFVar2;
  byte *pbVar3;
  int iVar4;
  byte *text;
  byte bVar5;
  undefined4 in_register_00000014;
  int iVar6;
  Fl_Cursor c;
  byte *pbVar7;
  byte *pbVar8;
  int iVar9;
  byte *pbVar10;
  
  text = (byte *)Fl::e_text;
  iVar9 = 0;
  if (0x10 < event - 1U) {
    return 0;
  }
  iVar4 = (&switchD_001ba1dc::switchdataD_002142ec)[event - 1U] + 0x2142ec;
  iVar6 = 1;
  iVar1 = 0;
  switch(event) {
  case 1:
    iVar9 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if ((iVar9 != 0) &&
       (pFVar2 = Fl_Widget::window(&this->super_Fl_Widget), pFVar2 != (Fl_Window *)0x0)) {
      pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
      Fl_Window::cursor(pFVar2,FL_CURSOR_INSERT);
    }
    handle_mouse(this,X,Y,iVar4,W,Fl::e_state & 0x10000);
    iVar1 = iVar6;
    if ((Fl_Input_ *)Fl::focus_ != this) {
      Fl::focus(&this->super_Fl_Widget);
      (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6);
    }
    break;
  case 2:
    copy(this,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)CONCAT44(in_register_00000014,X));
    iVar1 = iVar6;
    break;
  case 3:
  case 0xb:
    iVar9 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if (iVar9 == 0) {
      return 1;
    }
    pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
    if (pFVar2 == (Fl_Window *)0x0) {
      return 1;
    }
    pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
    c = FL_CURSOR_INSERT;
    goto LAB_001ba3d9;
  case 4:
    iVar9 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if (iVar9 == 0) {
      return 1;
    }
    pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
    if (pFVar2 == (Fl_Window *)0x0) {
      return 1;
    }
    pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
    c = FL_CURSOR_DEFAULT;
LAB_001ba3d9:
    Fl_Window::cursor(pFVar2,c);
    iVar1 = iVar6;
    break;
  case 5:
    handle_mouse(this,X,Y,iVar4,W,1);
    iVar1 = 1;
    break;
  case 6:
    iVar9 = this->textfont_;
    iVar1 = this->textsize_;
    iVar4 = (this->super_Fl_Widget).x_;
    iVar6 = (this->super_Fl_Widget).y_;
    W_00 = (this->super_Fl_Widget).w_;
    H_00 = (this->super_Fl_Widget).h_;
    pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
    fl_set_spot(iVar9,iVar1,iVar4,iVar6,W_00,H_00,pFVar2);
    iVar9 = this->position_;
    iVar1 = this->mark_;
    if (iVar1 == iVar9) {
      iVar1 = this->size_ + 1;
    }
    else if (iVar9 < iVar1) {
      iVar1 = iVar9;
    }
    minimal_update(this,iVar1);
    iVar1 = 1;
    break;
  case 7:
    iVar9 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if ((iVar9 != 0) &&
       (pFVar2 = Fl_Widget::window(&this->super_Fl_Widget), pFVar2 != (Fl_Window *)0x0)) {
      pFVar2 = Fl_Widget::window(&this->super_Fl_Widget);
      Fl_Window::cursor(pFVar2,FL_CURSOR_DEFAULT);
    }
    iVar9 = this->position_;
    iVar1 = this->mark_;
    if (iVar1 == iVar9) {
      if (((this->super_Fl_Widget).damage_ & 2) == 0) {
        minimal_update(this,iVar1);
        this->erase_cursor_only = '\x01';
      }
    }
    else {
      if (iVar9 < iVar1) {
        iVar1 = iVar9;
      }
      minimal_update(this,iVar1);
    }
  case 0xf:
    fl_reset_spot();
    iVar1 = iVar6;
    if ((((this->super_Fl_Widget).type_ & 8) == 0) && (((this->super_Fl_Widget).when_ & 4) != 0)) {
      maybe_do_callback(this);
    }
    break;
  case 0xc:
    if (this->shortcut_ == 0) {
      iVar4 = Fl_Widget::test_shortcut(&this->super_Fl_Widget);
    }
    else {
      iVar4 = Fl::test_shortcut(this->shortcut_);
    }
    iVar1 = iVar9;
    if (((iVar4 != 0) && (iVar9 = Fl::visible_focus(), iVar9 != 0)) &&
       (iVar9 = (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6), iVar9 != 0)) {
      Fl::focus(&this->super_Fl_Widget);
      iVar1 = iVar6;
    }
    break;
  case 0x11:
    bVar5 = (this->super_Fl_Widget).type_;
    if ((bVar5 & 8) != 0) {
      fl_beep(2);
      return 1;
    }
    if (Fl::e_text == (char *)0x0) {
      return 1;
    }
    if ((long)Fl::e_length == 0) {
      return 1;
    }
    pbVar10 = (byte *)(Fl::e_text + Fl::e_length);
    bVar5 = bVar5 & 7;
    if (bVar5 == 4) {
      if (Fl::e_length < 1) {
        return 1;
      }
LAB_001ba619:
      iVar1 = this->position_;
      iVar4 = this->mark_;
      iVar9 = (int)pbVar10 - (int)text;
    }
    else {
      iVar9 = Fl::e_length + 2;
      pbVar7 = pbVar10;
      do {
        pbVar10 = pbVar7;
        if (pbVar10 <= text) {
          return 1;
        }
        iVar1 = isspace((uint)pbVar10[-1]);
        iVar9 = iVar9 + -1;
        pbVar7 = pbVar10 + -1;
      } while (iVar1 != 0);
      pbVar7 = text;
      if (bVar5 == 1) {
        do {
          text = pbVar7;
          bVar5 = *text;
          iVar1 = isspace((uint)bVar5);
          pbVar7 = text + 1;
          iVar9 = iVar9 + -1;
          if (pbVar10 <= text) break;
        } while (iVar1 != 0);
        if ((bVar5 != 0x2b) && (bVar5 != 0x2d)) {
          pbVar7 = text;
        }
        do {
          bVar5 = *pbVar7;
          pbVar8 = pbVar7 + 1;
          if (pbVar10 <= pbVar7) break;
          pbVar7 = pbVar8;
        } while (bVar5 - 0x30 < 10);
        if (bVar5 == 0x2e) {
          do {
            pbVar7 = pbVar8;
            pbVar8 = pbVar7 + 1;
            if (pbVar10 <= pbVar7) break;
          } while (*pbVar7 - 0x30 < 10);
          if ((*pbVar7 | 0x20) == 0x65) {
            if ((*pbVar8 == 0x2b) || (pbVar3 = pbVar8, *pbVar8 == 0x2d)) {
              pbVar3 = pbVar7 + 2;
            }
            do {
              pbVar8 = pbVar3 + 1;
              if (pbVar10 <= pbVar3) break;
              bVar5 = *pbVar3;
              pbVar3 = pbVar8;
            } while (bVar5 - 0x30 < 10);
          }
        }
      }
      else {
        if (bVar5 != 2) goto LAB_001ba619;
        do {
          text = pbVar7;
          bVar5 = *text;
          iVar1 = isspace((uint)bVar5);
          pbVar7 = text + 1;
          iVar9 = iVar9 + -1;
          if (pbVar10 <= text) break;
        } while (iVar1 != 0);
        if ((bVar5 == 0x2b) || (pbVar3 = text, bVar5 == 0x2d)) {
          bVar5 = *pbVar7;
          pbVar3 = pbVar7;
        }
        if ((bVar5 == 0x30) && (pbVar3[1] == 0x78)) {
          pbVar7 = pbVar3 + 2;
          do {
            iVar1 = isxdigit((uint)*pbVar7);
            pbVar8 = pbVar7 + 1;
            if (pbVar10 <= pbVar7) break;
            pbVar7 = pbVar8;
          } while (iVar1 != 0);
        }
        else {
          do {
            pbVar8 = pbVar3 + 1;
            if (pbVar10 <= pbVar3) break;
            bVar5 = *pbVar3;
            pbVar3 = pbVar8;
          } while (bVar5 - 0x30 < 10);
        }
      }
      if (pbVar8 + -1 < pbVar10) {
        fl_beep(2);
        return 1;
      }
      iVar4 = this->size_;
      iVar1 = 0;
    }
    iVar9 = replace(this,iVar1,iVar4,(char *)text,iVar9);
    return iVar9;
  }
  return iVar1;
}

Assistant:

int Fl_Input_::handletext(int event, int X, int Y, int W, int H) {
  switch (event) {

  case FL_ENTER:
  case FL_MOVE:
    if (active_r() && window()) window()->cursor(FL_CURSOR_INSERT);
    return 1;

  case FL_LEAVE:
    if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    return 1;

  case FL_FOCUS:
    fl_set_spot(textfont(), textsize(), x(), y(), w(), h(), window());
    if (mark_ == position_) {
      minimal_update(size()+1);
    } else //if (Fl::selection_owner() != this)
      minimal_update(mark_, position_);
    return 1;

  case FL_UNFOCUS:
    if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    if (mark_ == position_) {
      if (!(damage()&FL_DAMAGE_EXPOSE)) {minimal_update(position_); erase_cursor_only = 1;}
    } else //if (Fl::selection_owner() != this)
      minimal_update(mark_, position_);
  case FL_HIDE:
    fl_reset_spot();
    if (!readonly() && (when() & FL_WHEN_RELEASE))
      maybe_do_callback();
    return 1;

  case FL_PUSH:
    if (active_r() && window()) window()->cursor(FL_CURSOR_INSERT);

    handle_mouse(X, Y, W, H, Fl::event_state(FL_SHIFT));

    if (Fl::focus() != this) {
      Fl::focus(this);
      handle(FL_FOCUS);
    }
    return 1;

  case FL_DRAG:
    handle_mouse(X, Y, W, H, 1);
    return 1;

  case FL_RELEASE:
    copy(0);
    return 1;

  case FL_PASTE: {
    // Don't allow pastes into readonly widgets...
    if (readonly()) {
      fl_beep(FL_BEEP_ERROR);
      return 1;
    }

    // See if we have anything to paste...
    if (!Fl::event_text() || !Fl::event_length()) return 1;

    // strip trailing control characters and spaces before pasting:
    const char* t = Fl::event_text();
    const char* e = t+Fl::event_length();
    if (input_type() != FL_MULTILINE_INPUT) while (e > t && isspace(*(e-1) & 255)) e--;
    if (!t || e <= t) return 1; // Int/float stuff will crash without this test
    if (input_type() == FL_INT_INPUT) {
      while (isspace(*t & 255) && t < e) t ++;
      const char *p = t;
      if (*p == '+' || *p == '-') p ++;
      if (strncmp(p, "0x", 2) == 0) {
        p += 2;
        while (isxdigit(*p & 255) && p < e) p ++;
      } else {
        while (isdigit(*p & 255) && p < e) p ++;
      }
      if (p < e) {
        fl_beep(FL_BEEP_ERROR);
        return 1;
      } else return replace(0, size(), t, (int) (e-t));
    } else if (input_type() == FL_FLOAT_INPUT) {
      while (isspace(*t & 255) && t < e) t ++;
      const char *p = t;
      if (*p == '+' || *p == '-') p ++;
      while (isdigit(*p & 255) && p < e) p ++;
      if (*p == '.') {
        p ++;
        while (isdigit(*p & 255) && p < e) p ++;
	if (*p == 'e' || *p == 'E') {
	  p ++;
	  if (*p == '+' || *p == '-') p ++;
	  while (isdigit(*p & 255) && p < e) p ++;
	}
      }
      if (p < e) {
        fl_beep(FL_BEEP_ERROR);
        return 1;
      } else return replace(0, size(), t, (int) (e-t));
    }
    return replace(position(), mark(), t, (int) (e-t));}

  case FL_SHORTCUT:
    if (!(shortcut() ? Fl::test_shortcut(shortcut()) : test_shortcut())) 
      return 0;
    if (Fl::visible_focus() && handle(FL_FOCUS)) {
      Fl::focus(this);
      return 1;
    } // else fall through

  default:
    return 0;
  }
}